

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

void load_impl_library(void)

{
  FILE *pFVar1;
  char *impl_library_name;
  undefined8 uVar2;
  char *env_library_name;
  
  impl_library_name = getenv("WPE_BACKEND_LIBRARY");
  if (impl_library_name != (char *)0x0) {
    s_impl_library = (void *)dlopen(impl_library_name,2);
    pFVar1 = _stderr;
    if (s_impl_library == (void *)0x0) {
      uVar2 = dlerror();
      fprintf(pFVar1,"wpe: could not load specified WPE_BACKEND_LIBRARY: %s\n",uVar2);
      abort();
    }
    wpe_loader_set_impl_library_name(impl_library_name);
  }
  if (s_impl_library == (void *)0x0) {
    s_impl_library = (void *)dlopen("libWPEBackend-default.so",2);
    pFVar1 = _stderr;
    if (s_impl_library == (void *)0x0) {
      uVar2 = dlerror();
      fprintf(pFVar1,"wpe: could not load the impl library. Is there any backend installed?: %s\n",
              uVar2);
      abort();
    }
    wpe_loader_set_impl_library_name("libWPEBackend-default.so");
  }
  s_impl_loader = (wpe_loader_interface *)dlsym(s_impl_library,"_wpe_loader_interface");
  return;
}

Assistant:

void
load_impl_library()
{
#ifdef WPE_BACKEND
    s_impl_library = dlopen(WPE_BACKEND, RTLD_NOW);
    if (!s_impl_library) {
        fprintf(stderr, "wpe: could not load compile-time defined WPE_BACKEND: %s\n", dlerror());
        abort();
    }
#else
#ifndef NDEBUG
    // Get the impl library from an environment variable, if available.
    char* env_library_name = getenv("WPE_BACKEND_LIBRARY");
    if (env_library_name) {
        s_impl_library = dlopen(env_library_name, RTLD_NOW);
        if (!s_impl_library) {
            fprintf(stderr, "wpe: could not load specified WPE_BACKEND_LIBRARY: %s\n", dlerror());
            abort();
        }
        wpe_loader_set_impl_library_name(env_library_name);
    }
#endif
    if (!s_impl_library) {
        // Load libWPEBackend-default.so by ... default.
        s_impl_library = dlopen("libWPEBackend-default.so", RTLD_NOW);
        if (!s_impl_library) {
            fprintf(stderr, "wpe: could not load the impl library. Is there any backend installed?: %s\n", dlerror());
            abort();
        }
        wpe_loader_set_impl_library_name("libWPEBackend-default.so");
    }
#endif

    s_impl_loader = dlsym(s_impl_library, "_wpe_loader_interface");
}